

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astopt.cpp
# Opt level: O1

int main(int argc,char **argsv)

{
  undefined8 uVar1;
  Lexer *pLVar2;
  bool bVar3;
  ostream *poVar4;
  int iVar5;
  LanguageConfiguration cfg;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  size_t reducedexpressions;
  Parser parser;
  Logger log;
  Lexer lex;
  istringstream input;
  LanguageConfiguration local_322;
  undefined1 local_320 [16];
  Lexer *local_310;
  pointer local_308;
  undefined1 local_300 [16];
  undefined1 local_2f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  _Alloc_hider local_2c8;
  _Base_ptr p_Stack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  pointer local_2a8;
  Logger local_2a0;
  Lexer local_278;
  istringstream local_198 [120];
  ios_base local_120 [264];
  
  iVar5 = 1;
  if ((argc == 2) && (*argsv[1] != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,argsv[1],(allocator<char> *)local_2f0);
    std::__cxx11::istringstream::istringstream(local_198,(string *)&local_278,_S_in);
    if ((istream **)local_278._vptr_Lexer != &local_278.input) {
      operator_delete(local_278._vptr_Lexer,(ulong)(local_278.input + 1));
    }
    local_322.multiLineString = false;
    local_322.multiLineStringLeftTrim = true;
    local_2f0._0_8_ = local_2f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"<args[1]>","");
    pfederc::Lexer::Lexer(&local_278,&local_322,(istream *)local_198,(string *)local_2f0);
    if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
      operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
    }
    pfederc::BaseLogger::BaseLogger
              ((BaseLogger *)local_2f0,(ostream *)&std::cout,(ostream *)&std::cerr);
    pfederc::Logger::Logger
              (&local_2a0,LVL_FAILURE|LVL_FATAL|LVL_HELP|LVL_NOTE|LVL_ERROR|LVL_WARNING,
               (BaseLogger *)local_2f0);
    pfederc::BaseLogger::~BaseLogger((BaseLogger *)local_2f0);
    pfederc::Lexer::next(&local_278);
    local_2b8._M_allocated_capacity = (size_type)&local_2c8;
    local_2f0._8_8_ = (_Base_ptr)0x0;
    local_2f0._16_8_ = 0;
    local_2d8._0_8_ = 0;
    local_2d8._8_8_ = 0;
    local_2c8._M_p = (pointer)0x0;
    p_Stack_2c0 = (_Base_ptr)0x0;
    local_2a8 = (pointer)0x0;
    local_2f0._0_8_ = &local_278;
    local_2b8._8_8_ = local_2b8._M_allocated_capacity;
    pfederc::Parser::parseExpression((Parser *)local_320,(Precedence)local_2f0);
    bVar3 = pfederc::logLexerErrors(&local_2a0,&local_278);
    iVar5 = 1;
    if (!bVar3) {
      if ((Lexer *)local_320._0_8_ == (Lexer *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERR",3);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        std::ostream::put('`');
        std::ostream::flush();
        pfederc::logParserErrors(&local_2a0,(Parser *)local_2f0);
      }
      else {
        bVar3 = pfederc::logParserErrors(&local_2a0,(Parser *)local_2f0);
        if (!bVar3) {
          local_320._8_8_ = (pointer)0x0;
          pfederc::optimizeAll
                    ((pfederc *)&local_310,
                     (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_320,
                     (size_t *)(local_320 + 8));
          pLVar2 = local_310;
          uVar1 = local_320._0_8_;
          local_310 = (Lexer *)0x0;
          local_320._0_8_ = pLVar2;
          if ((Expr *)uVar1 != (Expr *)0x0) {
            (**(code **)(*(long *)uVar1 + 8))();
          }
          if (local_310 != (Lexer *)0x0) {
            (*local_310->_vptr_Lexer[1])();
          }
          (**(code **)(*(long *)local_320._0_8_ + 0x10))(&local_310);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_310,(long)local_308);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          if (local_310 != (Lexer *)local_300) {
            operator_delete(local_310,local_300._0_8_ + 1);
          }
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          iVar5 = 0;
        }
      }
    }
    if ((_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_320._0_8_ !=
        (Expr *)0x0) {
      (**(code **)(*(long *)local_320._0_8_ + 8))();
    }
    pfederc::Parser::~Parser((Parser *)local_2f0);
    pfederc::Logger::~Logger(&local_2a0);
    pfederc::Lexer::~Lexer(&local_278);
    std::__cxx11::istringstream::~istringstream(local_198);
    std::ios_base::~ios_base(local_120);
  }
  return iVar5;
}

Assistant:

int main(int argc, char * argsv[]) {
  if (argc != 2 || strlen(argsv[1]) == 0)
    return 1;

  std::istringstream input(argsv[1]);
  LanguageConfiguration cfg = createDefaultLanguageConfiguration();
  Lexer lex(cfg, input, "<args[1]>");

  Logger log;
  
  lex.next();
  Parser parser(lex);
  auto expr = parser.parseExpression();

  if (logLexerErrors(log, lex))
    return 1;

  if (!expr) {
    std::cout << "ERR" << std::endl;
    logParserErrors(log, parser);
    return 1;
  }

  if (logParserErrors(log, parser))
    return 1;

  size_t reducedexpressions{0};
  expr = optimizeAll(std::move(expr), reducedexpressions);

  std::cout << expr->toString() << std::endl;
  std::cout << reducedexpressions << std::endl;

  return 0;
}